

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

KeyID __thiscall
anon_unknown.dwarf_378fef::SQLiteBuildDB::getKeyIDForID
          (SQLiteBuildDB *this,DBKeyID dbKeyID,string *error_out)

{
  BuildDBDelegate *pBVar1;
  bool bVar2;
  int iVar3;
  pointer pvVar4;
  undefined4 extraout_var;
  KeyID *pKVar5;
  DBKeyID *pDVar6;
  KeyType local_110;
  char *local_f0;
  char *text;
  undefined1 local_e0 [4];
  int size;
  string local_c0;
  string local_a0;
  string local_80;
  int local_5c;
  undefined1 auStack_58 [4];
  int result;
  ConstIterator local_48;
  undefined1 local_38 [8];
  iterator it;
  string *error_out_local;
  SQLiteBuildDB *this_local;
  DBKeyID dbKeyID_local;
  KeyID engineKeyID;
  
  it.End = (pointer)error_out;
  this_local = (SQLiteBuildDB *)dbKeyID.value;
  _local_38 = llvm::
              DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
              ::find((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                      *)&this->engineKeyIDs,(const_arg_type_t<DBKeyID>)&this_local);
  _auStack_58 = llvm::
                DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                ::end((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                       *)&this->engineKeyIDs);
  llvm::
  DenseMapIterator<DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>,true>
  ::DenseMapIterator<false,void>
            ((DenseMapIterator<DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>,true>
              *)&local_48,
             (DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
              *)auStack_58);
  bVar2 = llvm::
          DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
          ::operator!=((DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
                        *)local_38,&local_48);
  if (bVar2) {
    pvVar4 = llvm::
             DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
             ::operator->((DenseMapIterator<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>,_false>
                           *)local_38);
    dbKeyID_local.value = (pvVar4->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value;
  }
  else {
    local_5c = sqlite3_reset(this->findKeyNameForKeyIDStmt);
    if (local_5c == 0) {
      local_5c = sqlite3_clear_bindings(this->findKeyNameForKeyIDStmt);
      if (local_5c == 0) {
        local_5c = sqlite3_bind_int64(this->findKeyNameForKeyIDStmt,1,this_local);
        if (local_5c == 0) {
          local_5c = sqlite3_step(this->findKeyNameForKeyIDStmt);
          if (local_5c == 100) {
            iVar3 = sqlite3_column_count(this->findKeyNameForKeyIDStmt);
            if (iVar3 != 1) {
              __assert_fail("sqlite3_column_count(findKeyNameForKeyIDStmt) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                            ,0x3cf,
                            "KeyID (anonymous namespace)::SQLiteBuildDB::getKeyIDForID(DBKeyID, std::string *)"
                           );
            }
            text._4_4_ = sqlite3_column_bytes(this->findKeyNameForKeyIDStmt,0);
            local_f0 = (char *)sqlite3_column_text(this->findKeyNameForKeyIDStmt,0);
            pBVar1 = this->delegate;
            llbuild::core::KeyType::KeyType(&local_110,local_f0,(long)text._4_4_);
            iVar3 = (*pBVar1->_vptr_BuildDBDelegate[2])(pBVar1,&local_110);
            dbKeyID_local.value = CONCAT44(extraout_var,iVar3);
            llbuild::core::KeyType::~KeyType(&local_110);
            pKVar5 = llvm::
                     DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                     ::operator[]((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                   *)&this->engineKeyIDs,(DBKeyID *)&this_local);
            pKVar5->_value = dbKeyID_local.value;
            pDVar6 = llvm::
                     DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                     ::operator[]((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                   *)&this->dbKeyIDs,(KeyID *)&dbKeyID_local);
            pDVar6->value = (uint64_t)this_local;
          }
          else {
            (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                      ((string *)local_e0,this);
            std::__cxx11::string::operator=((string *)it.End,(string *)local_e0);
            std::__cxx11::string::~string((string *)local_e0);
            llbuild::core::KeyID::KeyID((KeyID *)&dbKeyID_local);
          }
        }
        else {
          (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
          std::__cxx11::string::operator=((string *)it.End,(string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          llbuild::core::KeyID::KeyID((KeyID *)&dbKeyID_local);
        }
      }
      else {
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_a0,this);
        std::__cxx11::string::operator=((string *)it.End,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        llbuild::core::KeyID::KeyID((KeyID *)&dbKeyID_local);
      }
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_80,this);
      std::__cxx11::string::operator=((string *)it.End,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      llbuild::core::KeyID::KeyID((KeyID *)&dbKeyID_local);
    }
  }
  return (KeyID)dbKeyID_local.value;
}

Assistant:

KeyID getKeyIDForID(DBKeyID dbKeyID, std::string *error_out) {
#define checkSQLiteResultOKReturnKeyID(result) \
if (result != SQLITE_OK) { \
  *error_out = getCurrentErrorMessage(); \
  return KeyID(); \
}

    // Search local db <-> engine mapping cache
    auto it = engineKeyIDs.find(dbKeyID);
    if (it != engineKeyIDs.end())
      return it->second;

    // Search for the key in the database
    int result;
    result = sqlite3_reset(findKeyNameForKeyIDStmt);
    checkSQLiteResultOKReturnKeyID(result);
    result = sqlite3_clear_bindings(findKeyNameForKeyIDStmt);
    checkSQLiteResultOKReturnKeyID(result);
    result = sqlite3_bind_int64(findKeyNameForKeyIDStmt, /*index=*/1, dbKeyID.value);
    checkSQLiteResultOKReturnKeyID(result);

    result = sqlite3_step(findKeyNameForKeyIDStmt);
    if (result != SQLITE_ROW) {
      *error_out = getCurrentErrorMessage();
      return KeyID();
    }
    assert(sqlite3_column_count(findKeyNameForKeyIDStmt) == 1);

    // Found a key
    auto size = sqlite3_column_bytes(findKeyNameForKeyIDStmt, 0);
    auto text = (const char*) sqlite3_column_text(findKeyNameForKeyIDStmt, 0);

    // Map the key to an engine ID
    auto engineKeyID = delegate->getKeyID(KeyType(text, size));

    // Cache the mapping locally
    engineKeyIDs[dbKeyID] = engineKeyID;
    dbKeyIDs[engineKeyID] = dbKeyID;

    return engineKeyID;
#undef checkSQLiteResultOKReturnKeyID
  }